

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegExpConstructor.cpp
# Opt level: O0

void __thiscall Js::JavascriptRegExpConstructor::EnsureValues(JavascriptRegExpConstructor *this)

{
  code *pcVar1;
  RegexPattern *pattern_00;
  ScriptContext *pSVar2;
  bool bVar3;
  uint16 uVar4;
  JavascriptString *pJVar5;
  RegexPattern **ppRVar6;
  JavascriptLibrary *this_00;
  Var pvVar7;
  JavascriptString **ppJVar8;
  undefined4 *puVar9;
  int *piVar10;
  void **ppvVar11;
  void *local_b0;
  JavascriptString *local_88;
  JavascriptString *local_80;
  uint local_6c;
  int local_68;
  int groupId_1;
  int groupId;
  uint local_5c;
  GroupInfo GStack_58;
  int numGroups;
  Var local_50;
  Var nonMatchValue;
  JavascriptString *pJStack_40;
  CharCount lastIndexVal;
  JavascriptString *emptyString;
  RegexPattern *local_30;
  RegexPattern *pattern;
  char16 *lastInputStr;
  ScriptContext *pSStack_18;
  CharCount lastInputLen;
  ScriptContext *scriptContext;
  JavascriptRegExpConstructor *this_local;
  
  scriptContext = (ScriptContext *)this;
  if ((this->reset & 1U) == 0) {
    if ((this->invalidatedLastMatch & 1U) != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegExpConstructor.cpp"
                                  ,0x85,"(!invalidatedLastMatch)","!invalidatedLastMatch");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
  }
  else {
    pSStack_18 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    pJVar5 = Memory::WriteBarrierPtr<Js::JavascriptString>::operator->(&this->lastInput);
    lastInputStr._4_4_ = JavascriptString::GetLength(pJVar5);
    pJVar5 = Memory::WriteBarrierPtr<Js::JavascriptString>::operator->(&this->lastInput);
    pattern = (RegexPattern *)JavascriptString::GetString(pJVar5);
    ppRVar6 = Memory::WriteBarrierPtr::operator_cast_to_RegexPattern__
                        ((WriteBarrierPtr *)&this->lastPattern);
    local_30 = *ppRVar6;
    if ((this->invalidatedLastMatch & 1U) != 0) {
      emptyString = (JavascriptString *)
                    RegexHelper::SimpleMatch
                              (pSStack_18,local_30,(char16 *)pattern,lastInputStr._4_4_,0);
      (this->lastMatch).offset = (Type)emptyString;
      (this->lastMatch).length = SUB84(emptyString,4);
      this->invalidatedLastMatch = false;
    }
    bVar3 = UnifiedRegex::GroupInfo::IsUndefined(&this->lastMatch);
    if (bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegExpConstructor.cpp"
                                  ,0x5d,"(!lastMatch.IsUndefined())","!lastMatch.IsUndefined()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    this_00 = ScriptContext::GetLibrary(pSStack_18);
    pJStack_40 = JavascriptLibrary::GetEmptyString(this_00);
    nonMatchValue._4_4_ = UnifiedRegex::GroupInfo::EndOffset(&this->lastMatch);
    pvVar7 = JavascriptNumber::ToVar((this->lastMatch).offset,pSStack_18);
    Memory::WriteBarrierPtr<void>::operator=(&this->index,pvVar7);
    pvVar7 = JavascriptNumber::ToVar(nonMatchValue._4_4_,pSStack_18);
    Memory::WriteBarrierPtr<void>::operator=(&this->lastIndex,pvVar7);
    if ((this->lastMatch).offset == 0) {
      local_80 = pJStack_40;
    }
    else {
      ppJVar8 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptString__
                          ((WriteBarrierPtr *)&this->lastInput);
      local_80 = SubString::New(*ppJVar8,0,(this->lastMatch).offset);
    }
    Memory::WriteBarrierPtr<void>::operator=(&this->leftContext,local_80);
    if ((nonMatchValue._4_4_ == 0) || (lastInputStr._4_4_ <= nonMatchValue._4_4_)) {
      local_88 = pJStack_40;
    }
    else {
      ppJVar8 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptString__
                          ((WriteBarrierPtr *)&this->lastInput);
      local_88 = SubString::New(*ppJVar8,nonMatchValue._4_4_,
                                lastInputStr._4_4_ - nonMatchValue._4_4_);
    }
    Memory::WriteBarrierPtr<void>::operator=(&this->rightContext,local_88);
    local_50 = RegexHelper::NonMatchValue(pSStack_18,true);
    pSVar2 = pSStack_18;
    ppJVar8 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptString__
                        ((WriteBarrierPtr *)&this->lastInput);
    GStack_58.offset = (this->lastMatch).offset;
    GStack_58.length = (this->lastMatch).length;
    pvVar7 = RegexHelper::GetString(pSVar2,*ppJVar8,local_50,GStack_58);
    Memory::WriteBarrierPtr<void>::operator=(this->captures,pvVar7);
    uVar4 = UnifiedRegex::RegexPattern::NumGroups(local_30);
    local_5c = (uint)uVar4;
    if (local_5c < 2) {
      Memory::WriteBarrierPtr<void>::operator=(&this->lastParen,pJStack_40);
    }
    else {
      bVar3 = UnifiedRegex::RegexPattern::WasLastMatchSuccessful(local_30);
      if (!bVar3) {
        RegexHelper::SimpleMatch
                  (pSStack_18,local_30,(char16 *)pattern,lastInputStr._4_4_,(this->lastMatch).offset
                  );
      }
      bVar3 = UnifiedRegex::RegexPattern::WasLastMatchSuccessful(local_30);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegExpConstructor.cpp"
                                    ,0x72,"(pattern->WasLastMatchSuccessful())",
                                    "pattern->WasLastMatchSuccessful()");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      for (local_68 = 1; piVar10 = min<int>((int *)&local_5c,&NumCtorCaptures), pSVar2 = pSStack_18,
          pattern_00 = local_30, local_68 < *piVar10; local_68 = local_68 + 1) {
        ppJVar8 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptString__
                            ((WriteBarrierPtr *)&this->lastInput);
        pvVar7 = RegexHelper::GetGroup(pSVar2,pattern_00,*ppJVar8,local_50,local_68);
        Memory::WriteBarrierPtr<void>::operator=(this->captures + local_68,pvVar7);
      }
      if ((int)local_5c < 0xb) {
        ppvVar11 = Memory::PointerValue<void>(this->captures + (int)(local_5c - 1));
        local_b0 = *ppvVar11;
      }
      else {
        ppJVar8 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptString__
                            ((WriteBarrierPtr *)&this->lastInput);
        local_b0 = RegexHelper::GetGroup(pSVar2,pattern_00,*ppJVar8,local_50,local_5c - 1);
      }
      Memory::WriteBarrierPtr<void>::operator=(&this->lastParen,local_b0);
    }
    for (local_6c = local_5c; (int)local_6c < 10; local_6c = local_6c + 1) {
      Memory::WriteBarrierPtr<void>::operator=(this->captures + (int)local_6c,pJStack_40);
    }
    this->reset = false;
  }
  return;
}

Assistant:

void JavascriptRegExpConstructor::EnsureValues()
    {
        if (reset)
        {
            ScriptContext* scriptContext = this->GetScriptContext();
            const CharCount lastInputLen = lastInput->GetLength();
            const char16* lastInputStr = lastInput->GetString();
            UnifiedRegex::RegexPattern* pattern = lastPattern;

            // When we perform a regex test operation it's possible the result of the operation will be loaded from a cache and the match will not be computed and updated in the ctor.
            // In that case we invalidate the last match stored in the ctor and will need to compute it before it will be accessible via $1 etc.
            // Since we only do this for the case of RegExp.prototype.test cache hit, we know several things:
            //  - The regex is not global or sticky
            //  - There was a match (test returned true)
            if (invalidatedLastMatch)
            {
                this->lastMatch = RegexHelper::SimpleMatch(scriptContext, pattern, lastInputStr, lastInputLen, 0);
                invalidatedLastMatch = false;
            }

            Assert(!lastMatch.IsUndefined());
            JavascriptString* emptyString = scriptContext->GetLibrary()->GetEmptyString();
            CharCount lastIndexVal = lastMatch.EndOffset();
            this->index = JavascriptNumber::ToVar(lastMatch.offset, scriptContext);
            this->lastIndex = JavascriptNumber::ToVar(lastIndexVal, scriptContext);
            this->leftContext = lastMatch.offset > 0 ? SubString::New(lastInput, 0, lastMatch.offset) : emptyString;
            this->rightContext = lastIndexVal > 0 && lastIndexVal < lastInputLen ? SubString::New(lastInput, lastIndexVal, lastInputLen - lastIndexVal) : emptyString;

            Var nonMatchValue = RegexHelper::NonMatchValue(scriptContext, true);
            captures[0] = RegexHelper::GetString(scriptContext, lastInput, nonMatchValue, lastMatch);
            int numGroups = pattern->NumGroups();
            if (numGroups > 1)
            {
                // The RegExp constructor's lastMatch holds the last *successful* match on any regular expression.
                // That regular expression may since have been used for *unsuccessful* matches, in which case
                // its groups will have been reset. Updating the RegExp constructor with the group binding after
                // every match is prohibitively slow. Instead, run the match again using the known last input string.
                if (!pattern->WasLastMatchSuccessful())
                {
                    RegexHelper::SimpleMatch(scriptContext, pattern, lastInputStr, lastInputLen, lastMatch.offset);
                }
                Assert(pattern->WasLastMatchSuccessful());
                for (int groupId = 1; groupId < min(numGroups, NumCtorCaptures); groupId++)
                    captures[groupId] = RegexHelper::GetGroup(scriptContext, pattern, lastInput, nonMatchValue, groupId);

                this->lastParen = numGroups <= NumCtorCaptures ?
                    PointerValue(captures[numGroups - 1]) :
                    RegexHelper::GetGroup(scriptContext, pattern, lastInput, nonMatchValue, numGroups - 1);
            }
            else
            {
                this->lastParen = emptyString;
            }
            for (int groupId = numGroups; groupId < NumCtorCaptures; groupId++)
                captures[groupId] = emptyString;
            reset = false;
        }
        else
        {
            // If we are not resetting the values, the last match cannot be invalidated.
            Assert(!invalidatedLastMatch);
        }
    }